

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  CommentInfo *pCVar4;
  ptrdiff_t pVar5;
  ptrdiff_t pVar6;
  bool bVar7;
  ushort uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  ValueHolder VVar13;
  ValueHolder *this_00;
  ulong uVar14;
  byte *pbVar15;
  ValueHolder local_88 [5];
  Value local_60;
  Value local_38;
  
  this_00 = local_88;
  pbVar3 = (byte *)token->end_;
  cVar1 = *token->start_;
  uVar14 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar15 = (byte *)(token->start_ + (cVar1 == '-'));
  if (pbVar15 < pbVar3) {
    uVar11 = uVar14 / 10;
    uVar9 = 0;
    do {
      bVar2 = *pbVar15;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_001085a6:
        bVar7 = decodeDouble(this,token,decoded);
        return bVar7;
      }
      pbVar15 = pbVar15 + 1;
      uVar12 = (ulong)(bVar2 - 0x30);
      if ((uVar11 <= uVar9) && (((uVar11 < uVar9 || (pbVar15 != pbVar3)) || (uVar14 % 10 < uVar12)))
         ) goto LAB_001085a6;
      uVar9 = uVar12 + uVar9 * 10;
    } while (pbVar15 < pbVar3);
    if (cVar1 != '-') {
      if (0x7fffffff < uVar9) {
        uVar10 = *(ushort *)&decoded->field_0x8;
        local_88[0] = decoded->value_;
        (decoded->value_).uint_ = uVar9;
        uVar8 = uVar10 & 0xfe00 | 2;
        goto LAB_001085cf;
      }
      goto LAB_001085b4;
    }
LAB_00108592:
    uVar10 = *(ushort *)&decoded->field_0x8;
    VVar13 = decoded->value_;
    (decoded->value_).int_ = -uVar9;
    this_00 = &local_38.value_;
  }
  else {
    uVar9 = 0;
    if (cVar1 == '-') goto LAB_00108592;
LAB_001085b4:
    uVar10 = *(ushort *)&decoded->field_0x8;
    VVar13 = decoded->value_;
    (decoded->value_).uint_ = uVar9;
    this_00 = &local_60.value_;
  }
  ((Value *)this_00)->value_ = VVar13;
  uVar8 = (uVar10 & 0xfe00) + 1;
LAB_001085cf:
  *(ushort *)&decoded->field_0x8 = uVar8;
  *(ushort *)&((Value *)this_00)->field_0x8 = uVar10 & 0x1ff;
  pCVar4 = decoded->comments_;
  decoded->comments_ = (CommentInfo *)0x0;
  ((Value *)this_00)->comments_ = pCVar4;
  pVar5 = decoded->start_;
  pVar6 = decoded->limit_;
  decoded->start_ = 0;
  decoded->limit_ = 0;
  ((Value *)this_00)->start_ = pVar5;
  ((Value *)this_00)->limit_ = pVar6;
  Value::~Value((Value *)this_00);
  return true;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}